

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O1

void csp_eth_arp_set_addr(uint8_t *mac_addr,uint16_t csp_addr)

{
  uint16_t uVar1;
  arp_list_entry_s *paVar2;
  arp_list_entry_t *paVar3;
  arp_list_entry_s **ppaVar4;
  arp_list_entry_t *paVar5;
  bool bVar6;
  
  bVar6 = arp_list == (arp_list_entry_t *)0x0;
  if (bVar6) {
    paVar3 = (arp_list_entry_t *)0x0;
  }
  else {
    uVar1 = arp_list->csp_addr;
    paVar3 = arp_list;
    while (uVar1 != csp_addr) {
      paVar2 = paVar3->next;
      bVar6 = paVar2 == (arp_list_entry_s *)0x0;
      if (bVar6) break;
      paVar3 = paVar2;
      uVar1 = paVar2->csp_addr;
    }
  }
  if (bVar6) {
    if (arp_used < 10) {
      paVar5 = arp_array + arp_used;
      arp_used = arp_used + 1;
    }
    else {
      paVar5 = (arp_list_entry_t *)0x0;
    }
    if (paVar5 != (arp_list_entry_t *)0x0) {
      paVar5->csp_addr = csp_addr;
      *(undefined4 *)paVar5->mac_addr = *(undefined4 *)mac_addr;
      *(undefined2 *)(paVar5->mac_addr + 4) = *(undefined2 *)(mac_addr + 4);
      paVar5->next = (arp_list_entry_s *)0x0;
      ppaVar4 = &arp_list;
      if (paVar3 != (arp_list_entry_t *)0x0) {
        ppaVar4 = &paVar3->next;
      }
      *ppaVar4 = paVar5;
    }
  }
  return;
}

Assistant:

void csp_eth_arp_set_addr(uint8_t * mac_addr, uint16_t csp_addr)
{
    arp_list_entry_t * last_arp = 0;
    for (arp_list_entry_t * arp = arp_list; arp; arp = arp->next) {
        last_arp = arp;
        if (arp->csp_addr == csp_addr) {
            // Already set
            return;
        }
    }

    // Create and add a new ARP entry
    arp_list_entry_t * new_arp = arp_alloc();

    if (new_arp) {
        new_arp->csp_addr = csp_addr;
        memcpy(new_arp->mac_addr, mac_addr, CSP_ETH_ALEN);
        new_arp->next = 0;

        if (last_arp) {
            last_arp->next = new_arp;
        } else {
            arp_list = new_arp;
        }
    }

}